

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

size_t zt_cstr_int_display_len(int value)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = 1 - (value >> 0x1f);
  for (; value - 1000U < 0xfffff831; value = value / 1000) {
    iVar2 = iVar2 + 3;
  }
  uVar1 = 2;
  if (0xffffff38 < value - 100U) {
    uVar1 = (uint)(value - 10U < 0xffffffed);
  }
  return (ulong)(uVar1 + iVar2);
}

Assistant:

size_t zt_cstr_int_display_len(int value)
{
    int result;
    result = value >= 0 ? 1 : 2;

    while ((value >= 1000) || (value <= -1000)) {
        result += 3;
        value /= 1000;
    }

    if ((value >= 100) || (value <= -100)) {
        return result + 2;
    }

    if ((value >= 10) || (value <= -10)) {
        return result + 1;
    }

    return result;
}